

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O3

void free_code(code_pointer cp)

{
  void *pvVar1;
  uint64 uVar2;
  
  if ((cp->inst).size != 0) {
    uVar2 = 0;
    do {
      pvVar1 = (*(cp->inst).get_ele)(&cp->inst,uVar2);
      if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
        free(*(void **)((long)pvVar1 + 8));
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (cp->inst).size);
  }
  free((cp->inst).start);
  return;
}

Assistant:

void free_code(code_pointer cp) {
    struct vec *ex = &cp->inst;
    void *arg;
    for (uint64 i = 0; i < ex->size; i++) {
        arg = ((instruction *) ex->get_ele(ex, i))->arg;
        if (arg != NULL)
            free(arg);
    }
    free(ex->start);
}